

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

int raplcap_destroy(raplcap *rc)

{
  void *__ptr;
  int local_1c;
  int ret;
  raplcap_msr *state;
  raplcap *rc_local;
  
  local_1c = 0;
  state = (raplcap_msr *)rc;
  if (rc == (raplcap *)0x0) {
    state = (raplcap_msr *)&rc_default;
  }
  __ptr = (void *)(state->ctx).power_units;
  if (__ptr != (void *)0x0) {
    local_1c = msr_sys_destroy(*(raplcap_msr_sys_ctx **)((long)__ptr + 0x38));
    free(__ptr);
    (state->ctx).power_units = 0.0;
  }
  *(undefined4 *)&(state->ctx).cfg = 0;
  return local_1c;
}

Assistant:

int raplcap_destroy(raplcap* rc) {
  raplcap_msr* state;
  int ret = 0;
  if (rc == NULL) {
    rc = &rc_default;
  }
  if ((state = (raplcap_msr*) rc->state) != NULL) {
    ret = msr_sys_destroy(state->sys);
    free(state);
    rc->state = NULL;
  }
  rc->nsockets = 0;
  raplcap_log(DEBUG, "raplcap_destroy: Destroyed\n");
  return ret;
}